

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool jessilib::starts_with_fast<char8_t>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string,
               u8string_view in_substring)

{
  ulong uVar1;
  bool bVar2;
  
  if (in_string._M_len < in_substring._M_len) {
    bVar2 = false;
  }
  else {
    for (uVar1 = 0;
        (bVar2 = in_substring._M_len == uVar1, !bVar2 &&
        (in_string._M_str[uVar1] == in_substring._M_str[uVar1])); uVar1 = uVar1 + 1) {
    }
  }
  return bVar2;
}

Assistant:

constexpr bool starts_with_fast(std::basic_string_view<CharT> in_string, std::u8string_view in_substring) {
	if (in_string.size() < in_substring.size()) {
		return false;
	}

	const CharT* itr = in_string.data();
	for (auto character : in_substring) {
		if (*itr != character) {
			return false;
		}

		++itr;
	}

	return true;
}